

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryGetOwnPropertyDescriptors
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptArray *this;
  Var instance;
  uint32 index;
  int in_stack_00000010;
  undefined1 local_a0 [8];
  PropertyDescriptor propDesc;
  CallInfo callInfo_local;
  ArgumentReader args;
  PropertyRecord *propertyRecord;
  void *local_48;
  Var propKey;
  ScriptContext *local_38;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  propDesc._40_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x2d7,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce12b9;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&propDesc.Configurable);
  local_38 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  if ((propDesc._40_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x2da,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00ce12b9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
    pRVar7 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
  }
  pRVar7 = JavascriptOperators::ToObject(pRVar7,local_38);
  if ((((pRVar7->type).ptr)->typeId == TypeIds_HostDispatch) &&
     (iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar7,EntryGetOwnPropertyDescriptors),
     iVar4 != 0)) {
    propKey = (Var)local_a0;
  }
  else {
    pSVar1 = local_38;
    this = JavascriptOperators::GetOwnPropertyKeys(pRVar7,local_38);
    propKey = JavascriptLibrary::CreateObject
                        ((pSVar1->super_ScriptContextBase).javascriptLibrary,true,
                         (PropertyIndex)(this->super_ArrayObject).length);
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
    local_48 = (Var)0x0;
    if ((this->super_ArrayObject).length != 0) {
      index = 0;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pSVar1 = local_38;
      do {
        BVar5 = JavascriptArray::DirectGetItemAt<void*>(this,index,&local_48);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x2fb,"(getPropResult)","getPropResult");
          if (!bVar3) goto LAB_00ce12b9;
          *puVar6 = 0;
        }
        else {
          JavascriptConversion::ToPropertyKey
                    (local_48,pSVar1,(PropertyRecord **)&args.super_Arguments.Values,
                     (PropertyString **)0x0);
          instance = GetOwnPropertyDescriptorHelper(pRVar7,local_48,pSVar1);
          BVar5 = JavascriptOperators::IsUndefined(instance);
          if (BVar5 == 0) {
            (**(code **)(*propKey + 0xb8))
                      (propKey,*(undefined4 *)(args.super_Arguments.Values + 1),instance,0,0);
          }
        }
        index = index + 1;
      } while (index < (this->super_ArrayObject).length);
    }
  }
  return propKey;
}

Assistant:

Var JavascriptObject::EntryGetOwnPropertyDescriptors(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* obj = nullptr;

    if (args.Info.Count < 2)
    {
        obj = JavascriptOperators::ToObject(scriptContext->GetLibrary()->GetUndefined(), scriptContext);
    }
    else
    {
        // Convert the argument to object first
        obj = JavascriptOperators::ToObject(args[1], scriptContext);
    }

    // If the object is HostDispatch try to invoke the operation remotely
    if (obj->GetTypeId() == TypeIds_HostDispatch)
    {
        Var result;
        if (obj->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyDescriptors, args, &result))
        {
            return result;
        }
    }

    JavascriptArray* ownPropertyKeys = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);
    RecyclableObject* resultObj = scriptContext->GetLibrary()->CreateObject(true, (Js::PropertyIndex) ownPropertyKeys->GetLength());

    PropertyDescriptor propDesc;
    Var propKey = nullptr;

    for (uint i = 0; i < ownPropertyKeys->GetLength(); i++)
    {
        BOOL getPropResult = ownPropertyKeys->DirectGetItemAt(i, &propKey);
        Assert(getPropResult);

        if (!getPropResult)
        {
            continue;
        }

        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propKey, scriptContext, &propertyRecord, nullptr);

        Var newDescriptor = JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propKey, scriptContext);
        if (!JavascriptOperators::IsUndefined(newDescriptor))
        {
            resultObj->SetProperty(propertyRecord->GetPropertyId(), newDescriptor, PropertyOperation_None, nullptr);
        }
    }

    return resultObj;
}